

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

void non_empty_closedir_cb(uv_fs_t *req)

{
  int iVar1;
  int iVar2;
  char *__s1;
  char **ppcVar3;
  char **ppcVar4;
  undefined8 uVar5;
  size_t sVar6;
  uv_getaddrinfo_t *puVar7;
  undefined4 *puVar8;
  int *piVar9;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long extraout_RDX_02;
  char *unaff_RBX;
  char *pcVar10;
  size_t *psVar11;
  undefined8 *puVar12;
  int *piVar13;
  long lVar14;
  undefined1 auStack_6a8 [144];
  undefined8 uStack_618;
  char **ppcStack_608;
  char **ppcStack_600;
  char **ppcStack_5f8;
  undefined1 auStack_5f0 [144];
  undefined8 uStack_560;
  char **ppcStack_550;
  code *pcStack_548;
  undefined1 auStack_540 [160];
  char **ppcStack_4a0;
  char *pcStack_490;
  long lStack_488;
  long lStack_480;
  char *pcStack_478;
  char **ppcStack_470;
  char **ppcStack_468;
  undefined1 *puStack_458;
  double dStack_448;
  double dStack_440;
  double dStack_438;
  char *pcStack_428;
  char *pcStack_418;
  char cStack_410;
  char cStack_40f;
  
  if (req == &closedir_req) {
    if (closedir_req.result == 0) {
      uv_fs_req_cleanup(&closedir_req);
      non_empty_closedir_cb_count = non_empty_closedir_cb_count + 1;
      return;
    }
  }
  else {
    non_empty_closedir_cb_cold_1();
  }
  non_empty_closedir_cb_cold_2();
  pcStack_418 = (char *)0x400;
  pcStack_428 = (char *)0x15b2d2;
  iVar1 = uv_exepath(&cStack_410);
  if (iVar1 == 0) {
    pcVar10 = executable_path;
    if ((executable_path[0] == '.') && (executable_path[1] == '/')) {
      pcVar10 = executable_path + 2;
    }
    pcStack_428 = (char *)0x15b307;
    __s1 = strstr(&cStack_410,pcVar10);
    if (__s1 == (char *)0x0) {
LAB_0015b419:
      pcStack_428 = (char *)0x15b41e;
      run_test_get_currentexe_cold_13();
      unaff_RBX = pcVar10;
      goto LAB_0015b41e;
    }
    pcStack_428 = (char *)0x15b31b;
    iVar1 = strcmp(__s1,pcVar10);
    unaff_RBX = pcStack_418;
    if (iVar1 != 0) goto LAB_0015b419;
    pcStack_428 = (char *)0x15b332;
    pcVar10 = (char *)strlen(&cStack_410);
    if (unaff_RBX != pcVar10) goto LAB_0015b423;
    pcStack_418 = (char *)0x400;
    pcStack_428 = (char *)0x15b34e;
    iVar1 = uv_exepath(0);
    if (iVar1 != -0x16) goto LAB_0015b428;
    pcStack_428 = (char *)0x15b363;
    iVar1 = uv_exepath(&cStack_410,0);
    if (iVar1 != -0x16) goto LAB_0015b42d;
    pcStack_418 = (char *)0x0;
    pcStack_428 = (char *)0x15b382;
    iVar1 = uv_exepath(&cStack_410);
    if (iVar1 != -0x16) goto LAB_0015b432;
    unaff_RBX = &cStack_410;
    pcStack_428 = (char *)0x15b3a2;
    memset(unaff_RBX,0xff,0x400);
    pcStack_418 = (char *)0x1;
    pcStack_428 = (char *)0x15b3b6;
    iVar1 = uv_exepath(unaff_RBX);
    if (iVar1 != 0) goto LAB_0015b437;
    if (pcStack_418 != (char *)0x0) goto LAB_0015b43c;
    if (cStack_410 != '\0') goto LAB_0015b441;
    unaff_RBX = &cStack_410;
    pcStack_428 = (char *)0x15b3e0;
    memset(unaff_RBX,0xff,0x400);
    pcStack_418 = (char *)0x2;
    pcStack_428 = (char *)0x15b3f4;
    iVar1 = uv_exepath(unaff_RBX);
    if (iVar1 != 0) goto LAB_0015b446;
    if (pcStack_418 != (char *)0x1) goto LAB_0015b44b;
    if (cStack_410 == '\0') goto LAB_0015b450;
    if (cStack_40f == '\0') {
      return;
    }
  }
  else {
LAB_0015b41e:
    pcStack_428 = (char *)0x15b423;
    run_test_get_currentexe_cold_1();
LAB_0015b423:
    pcStack_428 = (char *)0x15b428;
    run_test_get_currentexe_cold_2();
LAB_0015b428:
    pcStack_428 = (char *)0x15b42d;
    run_test_get_currentexe_cold_3();
LAB_0015b42d:
    pcStack_428 = (char *)0x15b432;
    run_test_get_currentexe_cold_4();
LAB_0015b432:
    pcStack_428 = (char *)0x15b437;
    run_test_get_currentexe_cold_5();
LAB_0015b437:
    pcStack_428 = (char *)0x15b43c;
    run_test_get_currentexe_cold_6();
LAB_0015b43c:
    pcStack_428 = (char *)0x15b441;
    run_test_get_currentexe_cold_7();
LAB_0015b441:
    pcStack_428 = (char *)0x15b446;
    run_test_get_currentexe_cold_8();
LAB_0015b446:
    pcStack_428 = (char *)0x15b44b;
    run_test_get_currentexe_cold_9();
LAB_0015b44b:
    pcStack_428 = (char *)0x15b450;
    run_test_get_currentexe_cold_10();
LAB_0015b450:
    pcStack_428 = (char *)0x15b455;
    run_test_get_currentexe_cold_12();
  }
  pcStack_428 = (char *)0x15b45a;
  run_test_get_currentexe_cold_11();
  dStack_448 = -1.0;
  dStack_440 = -1.0;
  dStack_438 = -1.0;
  pcStack_428 = unaff_RBX;
  uv_loadavg(&dStack_448);
  if (dStack_448 < 0.0) {
    run_test_get_loadavg_cold_3();
LAB_0015b4bd:
    run_test_get_loadavg_cold_2();
  }
  else {
    if (dStack_440 < 0.0) goto LAB_0015b4bd;
    if (0.0 <= dStack_438) {
      return;
    }
  }
  run_test_get_loadavg_cold_1();
  ppcStack_468 = (char **)0x15b4d1;
  puStack_458 = (undefined1 *)&dStack_448;
  ppcVar3 = (char **)uv_get_free_memory();
  ppcStack_468 = (char **)0x15b4d9;
  ppcVar4 = (char **)uv_get_total_memory();
  ppcStack_468 = (char **)0x15b4e1;
  uVar5 = uv_get_constrained_memory();
  ppcStack_468 = (char **)0x15b4f8;
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",ppcVar3,ppcVar4,uVar5);
  if (ppcVar3 == (char **)0x0) {
    ppcStack_468 = (char **)0x15b516;
    run_test_get_memory_cold_3();
LAB_0015b516:
    ppcStack_468 = (char **)0x15b51b;
    run_test_get_memory_cold_2();
  }
  else {
    if (ppcVar4 == (char **)0x0) goto LAB_0015b516;
    if (ppcVar3 < ppcVar4) {
      return;
    }
  }
  ppcStack_468 = (char **)run_test_get_passwd;
  run_test_get_memory_cold_1();
  ppcStack_4a0 = (char **)0x15b52f;
  ppcStack_468 = ppcVar3;
  iVar1 = uv_os_get_passwd(&pcStack_490);
  ppcVar4 = ppcStack_470;
  if (iVar1 == 0) {
    if (*pcStack_490 == '\0') goto LAB_0015b5f3;
    if (*pcStack_478 == '\0') goto LAB_0015b5f8;
    ppcStack_4a0 = (char **)0x15b560;
    sVar6 = strlen((char *)ppcStack_470);
    ppcVar3 = ppcVar4;
    if (sVar6 != 1) {
      if (sVar6 != 0) {
        if (*(char *)((long)ppcVar4 + (sVar6 - 1)) == '/') {
          ppcStack_4a0 = (char **)0x15b57b;
          run_test_get_passwd_cold_13();
          goto LAB_0015b57b;
        }
        goto LAB_0015b584;
      }
      goto LAB_0015b62a;
    }
LAB_0015b57b:
    if (*(char *)ppcVar4 == '/') {
LAB_0015b584:
      if (lStack_488 < 0) goto LAB_0015b5fd;
      if (lStack_480 < 0) goto LAB_0015b602;
      ppcVar3 = &pcStack_490;
      ppcStack_4a0 = (char **)0x15b5a1;
      uv_os_free_passwd(ppcVar3);
      if (pcStack_490 != (char *)0x0) goto LAB_0015b607;
      if (pcStack_478 != (char *)0x0) goto LAB_0015b60c;
      if (ppcStack_470 != (char **)0x0) goto LAB_0015b611;
      ppcVar3 = &pcStack_490;
      ppcStack_4a0 = (char **)0x15b5c4;
      uv_os_free_passwd(ppcVar3);
      if (pcStack_490 != (char *)0x0) goto LAB_0015b616;
      if (pcStack_478 != (char *)0x0) goto LAB_0015b61b;
      if (ppcStack_470 != (char **)0x0) goto LAB_0015b620;
      ppcStack_4a0 = (char **)0x15b5e1;
      iVar1 = uv_os_get_passwd(0);
      if (iVar1 == -0x16) {
        return;
      }
      goto LAB_0015b625;
    }
  }
  else {
    ppcStack_4a0 = (char **)0x15b5f3;
    run_test_get_passwd_cold_1();
LAB_0015b5f3:
    ppcStack_4a0 = (char **)0x15b5f8;
    run_test_get_passwd_cold_15();
LAB_0015b5f8:
    ppcStack_4a0 = (char **)0x15b5fd;
    run_test_get_passwd_cold_14();
LAB_0015b5fd:
    ppcStack_4a0 = (char **)0x15b602;
    run_test_get_passwd_cold_4();
LAB_0015b602:
    ppcStack_4a0 = (char **)0x15b607;
    run_test_get_passwd_cold_5();
LAB_0015b607:
    ppcStack_4a0 = (char **)0x15b60c;
    run_test_get_passwd_cold_6();
LAB_0015b60c:
    ppcStack_4a0 = (char **)0x15b611;
    run_test_get_passwd_cold_7();
LAB_0015b611:
    ppcStack_4a0 = (char **)0x15b616;
    run_test_get_passwd_cold_8();
LAB_0015b616:
    ppcStack_4a0 = (char **)0x15b61b;
    run_test_get_passwd_cold_9();
LAB_0015b61b:
    ppcStack_4a0 = (char **)0x15b620;
    run_test_get_passwd_cold_10();
LAB_0015b620:
    ppcStack_4a0 = (char **)0x15b625;
    run_test_get_passwd_cold_11();
LAB_0015b625:
    ppcStack_4a0 = (char **)0x15b62a;
    run_test_get_passwd_cold_12();
LAB_0015b62a:
    ppcStack_4a0 = (char **)0x15b62f;
    run_test_get_passwd_cold_3();
  }
  ppcStack_4a0 = (char **)run_test_getaddrinfo_fail;
  run_test_get_passwd_cold_2();
  iVar1 = (int)auStack_540;
  pcStack_548 = (code *)0x15b641;
  ppcStack_4a0 = ppcVar3;
  uVar5 = uv_default_loop();
  pcStack_548 = (code *)0x15b65b;
  iVar2 = uv_getaddrinfo(uVar5,auStack_540,abort,0,0,0);
  if (iVar2 == -0x16) {
    pcStack_548 = (code *)0x15b669;
    uVar5 = uv_default_loop();
    pcStack_548 = (code *)0x15b688;
    iVar1 = (int)auStack_540;
    iVar2 = uv_getaddrinfo(uVar5,auStack_540,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",0,0);
    if (iVar2 != 0) goto LAB_0015b6ec;
    pcStack_548 = (code *)0x15b691;
    uVar5 = uv_default_loop();
    iVar1 = 0;
    pcStack_548 = (code *)0x15b69b;
    iVar2 = uv_run(uVar5);
    if (iVar2 != 0) goto LAB_0015b6f1;
    if (fail_cb_called != 1) goto LAB_0015b6f6;
    pcStack_548 = (code *)0x15b6ad;
    ppcVar3 = (char **)uv_default_loop();
    pcStack_548 = (code *)0x15b6c1;
    uv_walk(ppcVar3,close_walk_cb,0);
    iVar1 = 0;
    pcStack_548 = (code *)0x15b6cb;
    uv_run(ppcVar3);
    pcStack_548 = (code *)0x15b6d0;
    uVar5 = uv_default_loop();
    pcStack_548 = (code *)0x15b6d8;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_548 = (code *)0x15b6ec;
    run_test_getaddrinfo_fail_cold_1();
LAB_0015b6ec:
    pcStack_548 = (code *)0x15b6f1;
    run_test_getaddrinfo_fail_cold_2();
LAB_0015b6f1:
    pcStack_548 = (code *)0x15b6f6;
    run_test_getaddrinfo_fail_cold_3();
LAB_0015b6f6:
    pcStack_548 = (code *)0x15b6fb;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_548 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar1) goto LAB_0015b727;
    if (extraout_RDX == 0) {
      ppcStack_550 = (char **)0x15b71a;
      uv_freeaddrinfo(0);
      fail_cb_called = fail_cb_called + 1;
      return;
    }
  }
  else {
    ppcStack_550 = (char **)0x15b727;
    getaddrinfo_fail_cb_cold_1();
LAB_0015b727:
    ppcStack_550 = (char **)0x15b72c;
    getaddrinfo_fail_cb_cold_2();
  }
  ppcStack_550 = (char **)run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  ppcStack_5f8 = (char **)0x15b73e;
  ppcStack_550 = ppcVar3;
  uVar5 = uv_default_loop();
  ppcStack_5f8 = (char **)0x15b758;
  iVar1 = uv_getaddrinfo(uVar5,auStack_5f0,0,"xyzzy.xyzzy.xyzzy.",0,0);
  if (iVar1 < 0) {
    ppcStack_5f8 = (char **)0x15b769;
    uv_freeaddrinfo(uStack_560);
    ppcStack_5f8 = (char **)0x15b76e;
    ppcVar3 = (char **)uv_default_loop();
    ppcStack_5f8 = (char **)0x15b782;
    uv_walk(ppcVar3,close_walk_cb,0);
    ppcStack_5f8 = (char **)0x15b78c;
    uv_run(ppcVar3,0);
    ppcStack_5f8 = (char **)0x15b791;
    uVar5 = uv_default_loop();
    ppcStack_5f8 = (char **)0x15b799;
    iVar1 = uv_loop_close(uVar5);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    ppcStack_5f8 = (char **)0x15b7ad;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  ppcStack_5f8 = (char **)run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  ppcStack_600 = (char **)0x15b7bd;
  ppcStack_5f8 = ppcVar3;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  ppcStack_600 = (char **)0x15b7c9;
  puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
  ppcStack_600 = (char **)0x15b7ec;
  iVar1 = uv_getaddrinfo(puVar7,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
  if (iVar1 == 0) {
    ppcStack_600 = (char **)0x15b7f5;
    puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_600 = (char **)0x15b7ff;
    uv_run(puVar7,0);
    if (getaddrinfo_cbs != 1) goto LAB_0015b845;
    ppcStack_600 = (char **)0x15b80d;
    ppcVar3 = (char **)uv_default_loop();
    ppcStack_600 = (char **)0x15b821;
    uv_walk(ppcVar3,close_walk_cb,0);
    ppcStack_600 = (char **)0x15b82b;
    uv_run(ppcVar3,0);
    ppcStack_600 = (char **)0x15b830;
    puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_600 = (char **)0x15b838;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    ppcStack_600 = (char **)0x15b845;
    run_test_getaddrinfo_basic_cold_1();
LAB_0015b845:
    ppcStack_600 = (char **)0x15b84a;
    run_test_getaddrinfo_basic_cold_2();
  }
  ppcStack_600 = (char **)getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  ppcStack_600 = ppcVar3;
  if (getaddrinfo_handle == puVar7) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    ppcStack_608 = (char **)0x15b867;
    free(puVar7);
    uv_freeaddrinfo(extraout_RDX_00);
    return;
  }
  ppcStack_608 = (char **)run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  ppcStack_608 = ppcVar3;
  uVar5 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar5,auStack_6a8,0,"localhost",0,0);
  if (iVar1 == 0) {
    uv_freeaddrinfo(uStack_618);
    ppcVar3 = (char **)uv_default_loop();
    uv_walk(ppcVar3,close_walk_cb,0);
    uv_run(ppcVar3,0);
    uVar5 = uv_default_loop();
    iVar1 = uv_loop_close(uVar5);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  puVar7 = getaddrinfo_handles;
  piVar13 = callback_counts;
  lVar14 = 0;
  do {
    *piVar13 = 0;
    puVar12 = (undefined8 *)0x4;
    puVar8 = (undefined4 *)malloc(4);
    if (puVar8 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015b9e4:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0015b9e9;
    }
    *puVar8 = (int)lVar14;
    puVar7->data = puVar8;
    puVar12 = (undefined8 *)uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar12,puVar7,getaddrinfo_cuncurrent_cb,"localhost",0,0,ppcVar3);
    if (iVar1 != 0) goto LAB_0015b9e4;
    lVar14 = lVar14 + 1;
    puVar7 = puVar7 + 1;
    piVar13 = piVar13 + 1;
  } while (lVar14 != 10);
  puVar12 = (undefined8 *)uv_default_loop();
  lVar14 = 0;
  uv_run(puVar12,0);
  do {
    if (*(int *)((long)callback_counts + lVar14) != 1) goto LAB_0015b9e9;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0x28);
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  puVar12 = (undefined8 *)uv_default_loop();
  iVar1 = uv_loop_close();
  if (iVar1 == 0) {
    return;
  }
LAB_0015b9ee:
  run_test_getaddrinfo_concurrent_cold_3();
  piVar13 = (int *)*puVar12;
  piVar9 = callback_counts;
  psVar11 = &closedir_req.bufsml[1].len;
  lVar14 = 0;
  do {
    psVar11 = psVar11 + 0x14;
    if (psVar11 == puVar12) goto LAB_0015ba2b;
    piVar9 = piVar9 + 1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar14 = extraout_RDX_02;
LAB_0015ba2b:
  if (*piVar13 == (int)lVar14) {
    *piVar9 = *piVar9 + 1;
    free(piVar13);
    uv_freeaddrinfo(extraout_RDX_01);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(piVar13,0);
  return;
LAB_0015b9e9:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015b9ee;
}

Assistant:

static void non_empty_closedir_cb(uv_fs_t* req) {
  ASSERT(req == &closedir_req);
  ASSERT(req->result == 0);
  uv_fs_req_cleanup(req);
  ++non_empty_closedir_cb_count;
}